

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::Array<kj::CappedArray<char,_17UL>_>::~Array(Array<kj::CappedArray<char,_17UL>_> *this)

{
  Array<kj::CappedArray<char,_17UL>_> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }